

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O0

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          Orphanage *this,uint size)

{
  OrphanBuilder local_40;
  uint local_1c;
  Orphanage *pOStack_18;
  uint size_local;
  Orphanage *this_local;
  
  local_1c = size;
  pOStack_18 = this;
  this_local = (Orphanage *)__return_storage_ptr__;
  NewOrphanListImpl<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::apply
            (&local_40,this->arena,this->capTable,size);
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::Orphan
            (__return_storage_ptr__,&local_40);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Orphan<RootType> Orphanage::newOrphan(uint size) const {
  return Orphan<RootType>(NewOrphanListImpl<RootType>::apply(arena, capTable, size));
}